

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int whereLoopAddBtree(WhereLoopBuilder *pBuilder,Bitmask mPrereq)

{
  byte *pbVar1;
  short *psVar2;
  byte bVar3;
  long lVar4;
  WhereLoop *pTemplate;
  WhereInfo *pWInfo;
  SrcList *pSVar5;
  Table *pTVar6;
  WhereClause *pWC;
  ExprList *pEVar7;
  bool bVar8;
  u8 uVar9;
  ushort uVar10;
  LogEst LVar11;
  LogEst a;
  short sVar12;
  LogEst LVar13;
  int iVar14;
  u32 uVar15;
  int iVar16;
  Expr *pA;
  WhereTerm *pWVar17;
  Index *pIdx;
  short b;
  ulong uVar18;
  ExprList_item *pEVar19;
  long lVar20;
  u8 uVar21;
  WhereTerm *pWVar22;
  long lVar23;
  long in_FS_OFFSET;
  Bitmask local_b8;
  i16 aiColumnPk;
  LogEst aiRowEstPk [2];
  Index sPk;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  sPk._96_8_ = &DAT_aaaaaaaaaaaaaaaa;
  sPk.colNotIdxed = (Bitmask)&DAT_aaaaaaaaaaaaaaaa;
  sPk.aColExpr = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
  sPk._88_8_ = &DAT_aaaaaaaaaaaaaaaa;
  sPk.azColl = (char **)&DAT_aaaaaaaaaaaaaaaa;
  sPk.pPartIdxWhere = (Expr *)&DAT_aaaaaaaaaaaaaaaa;
  sPk.pSchema = (Schema *)&DAT_aaaaaaaaaaaaaaaa;
  sPk.aSortOrder = &DAT_aaaaaaaaaaaaaaaa;
  sPk.zColAff = &DAT_aaaaaaaaaaaaaaaa;
  sPk.pNext = (Index *)&DAT_aaaaaaaaaaaaaaaa;
  sPk.aiRowLogEst = (LogEst *)&DAT_aaaaaaaaaaaaaaaa;
  sPk.pTable = (Table *)&DAT_aaaaaaaaaaaaaaaa;
  sPk.zName = &DAT_aaaaaaaaaaaaaaaa;
  sPk.aiColumn = (i16 *)&DAT_aaaaaaaaaaaaaaaa;
  aiRowEstPk[0] = -0x5556;
  aiRowEstPk[1] = -0x5556;
  aiColumnPk = -1;
  pTemplate = pBuilder->pNew;
  pWInfo = pBuilder->pWInfo;
  pSVar5 = pWInfo->pTabList;
  bVar3 = pTemplate->iTab;
  pTVar6 = pSVar5->a[bVar3].pSTab;
  uVar10 = *(ushort *)&pSVar5->a[bVar3].fg.field_0x1;
  if ((uVar10 & 2) == 0) {
    if ((pTVar6->tabFlags & 0x80) == 0) {
      pIdx = &sPk;
      sPk.colNotIdxed = 0;
      sPk.zName = (char *)0x0;
      sPk.aColExpr = (ExprList *)0x0;
      sPk.azColl = (char **)0x0;
      sPk.pPartIdxWhere = (Expr *)0x0;
      sPk.pSchema = (Schema *)0x0;
      sPk.aSortOrder = (u8 *)0x0;
      sPk.zColAff = (char *)0x0;
      sPk.pNext = (Index *)0x0;
      sPk.aiColumn = &aiColumnPk;
      sPk.aiRowLogEst = aiRowEstPk;
      sPk.pTable = pTVar6;
      sPk.tnum = 0;
      sPk.szIdxRow = 3;
      sPk.nKeyCol = 1;
      sPk.nColumn = 1;
      sPk.onError = '\x05';
      sPk._99_5_ = 3;
      aiRowEstPk[1] = 0;
      aiRowEstPk[0] = pTVar6->nRowLogEst;
      if ((uVar10 & 1) == 0) {
        sPk.pNext = pTVar6->pIndex;
      }
    }
    else {
      pIdx = pTVar6->pIndex;
    }
  }
  else {
    pIdx = pSVar5->a[bVar3].u2.pIBIndex;
  }
  pWC = pBuilder->pWC;
  iVar14 = 0;
  if ((((pBuilder->pOrSet == (WhereOrSet *)0x0) && (iVar14 = 0, (pWInfo->wctrlFlags & 0x1020) == 0))
      && (iVar14 = 0, (pWInfo->pParse->db->flags & 0x8000) != 0)) &&
     ((iVar14 = 0, (uVar10 & 0x93) == 0 && (iVar14 = 0, (pSVar5->a[bVar3].fg.jointype & 0x10) == 0))
     )) {
    LVar11 = pTVar6->nRowLogEst;
    pWVar17 = pWC->a;
    pWVar22 = pWVar17 + pWC->nTerm;
    a = estLog(LVar11);
    iVar14 = 0;
    for (; (iVar14 == 0 && (pWVar17 < pWVar22)); pWVar17 = pWVar17 + 1) {
      iVar14 = 0;
      if ((pWVar17->prereqRight & pTemplate->maskSelf) == 0) {
        iVar14 = 0;
        iVar16 = termCanDriveIndex(pWVar17,pSVar5->a + bVar3,0);
        if (iVar16 != 0) {
          (pTemplate->u).btree.nEq = 1;
          (pTemplate->u).btree.pIndex = (Index *)0x0;
          pTemplate->nLTerm = 1;
          pTemplate->nSkip = 0;
          *pTemplate->aLTerm = pWVar17;
          if ((pTVar6->eTabType == '\x02') ||
             (sVar12 = a + LVar11 + 0x1c, (pTVar6->tabFlags & 0x4000) != 0)) {
            sVar12 = a + LVar11 + -0x19;
          }
          LVar13 = 0;
          if (0 < sVar12) {
            LVar13 = sVar12;
          }
          pTemplate->rSetup = LVar13;
          pTemplate->nOut = 0x2b;
          LVar13 = sqlite3LogEstAdd(a,0x2b);
          pTemplate->rRun = LVar13;
          pTemplate->wsFlags = 0x4000;
          pTemplate->prereq = pWVar17->prereqRight | mPrereq;
          iVar14 = whereLoopInsert(pBuilder,pTemplate);
        }
      }
    }
  }
  uVar21 = '\x01';
LAB_0018b29a:
  if ((iVar14 == 0) && (pIdx != (Index *)0x0)) {
    if (((pIdx->pPartIdxWhere == (Expr *)0x0) ||
        (iVar14 = whereUsablePartialIndex
                            (pSVar5->a[bVar3].iCursor,pSVar5->a[bVar3].fg.jointype,pWC,
                             pIdx->pPartIdxWhere), iVar14 != 0)) && ((pIdx->field_0x64 & 2) == 0)) {
      sVar12 = *pIdx->aiRowLogEst;
      (pTemplate->u).vtab.idxNum = 0;
      (pTemplate->u).btree.nTop = 0;
      pTemplate->nLTerm = 0;
      pTemplate->nSkip = 0;
      pTemplate->iSortIdx = '\0';
      pTemplate->rSetup = 0;
      pTemplate->prereq = mPrereq;
      pTemplate->nOut = sVar12;
      (pTemplate->u).btree.pIndex = pIdx;
      (pTemplate->u).btree.pOrderBy = (ExprList *)0x0;
      bVar8 = true;
      if (((pIdx->field_0x63 & 4) == 0) &&
         (pEVar7 = pBuilder->pWInfo->pOrderBy, pEVar7 != (ExprList *)0x0)) {
        iVar14 = pSVar5->a[bVar3].iCursor;
        for (lVar23 = 0; bVar8 = pEVar7->nExpr <= lVar23, lVar23 < pEVar7->nExpr;
            lVar23 = lVar23 + 1) {
          pA = sqlite3ExprSkipCollateAndLikely(pEVar7->a[lVar23].pExpr);
          if (pA != (Expr *)0x0) {
            if (((pA->op | 2) == 0xaa) && (pA->iTable == iVar14)) {
              if (pA->iColumn < 0) break;
              uVar18 = 0;
              while (pIdx->nKeyCol != uVar18) {
                psVar2 = pIdx->aiColumn + uVar18;
                uVar18 = uVar18 + 1;
                if (pA->iColumn == *psVar2) goto LAB_0018b434;
              }
            }
            else if (pIdx->aColExpr != (ExprList *)0x0) {
              pEVar19 = pIdx->aColExpr->a;
              for (uVar18 = 0; uVar18 < pIdx->nKeyCol; uVar18 = uVar18 + 1) {
                if ((pIdx->aiColumn[uVar18] == -2) &&
                   (iVar16 = sqlite3ExprCompareSkip(pA,pEVar19->pExpr,iVar14), iVar16 == 0))
                goto LAB_0018b434;
                pEVar19 = pEVar19 + 1;
              }
            }
          }
        }
      }
      goto LAB_0018b441;
    }
    iVar14 = 0;
    goto LAB_0018b736;
  }
LAB_0018b91c:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return iVar14;
LAB_0018b434:
  bVar8 = false;
LAB_0018b441:
  if ((~*(ushort *)&pIdx->field_0x63 & 3) == 0) {
    uVar9 = uVar21;
    if (bVar8) {
      uVar9 = '\0';
    }
    pTemplate->wsFlags = 0x100;
    pTemplate->iSortIdx = uVar9;
    pTemplate->rRun = sVar12 + 0x10;
    whereLoopOutputAdjust(pWC,pTemplate,sVar12);
    uVar10 = *(ushort *)&pSVar5->a[bVar3].fg.field_0x1;
    if ((uVar10 & 4) != 0) {
      if ((uVar10 & 0x40) != 0) {
        pbVar1 = (byte *)((long)&pTemplate->wsFlags + 3);
        *pbVar1 = *pbVar1 | 2;
      }
      (pTemplate->u).btree.pOrderBy = (pSVar5->a[bVar3].u4.pSubq)->pSelect->pOrderBy;
    }
    iVar14 = whereLoopInsert(pBuilder,pTemplate);
    pTemplate->nOut = sVar12;
  }
  else {
    if ((*(ushort *)&pIdx->field_0x63 & 0x20) == 0) {
      local_b8 = pIdx->colNotIdxed & pSVar5->a[bVar3].colUsed;
      if (pIdx->pPartIdxWhere != (Expr *)0x0) {
        wherePartIdxExpr(pWInfo->pParse,pIdx,pIdx->pPartIdxWhere,&local_b8,0,(SrcItem *)0x0);
      }
      pTemplate->wsFlags = 0x200;
      if (((*(ushort *)&pIdx->field_0x63 >> 0xc & 1) == 0) ||
         (local_b8 == 0 || ((byte)(*(ushort *)&pIdx->field_0x63 >> 0xb) & 1) != 0)) {
        if ((local_b8 == 0) &&
           (((uVar15 = 0x240, (pTVar6->tabFlags & 0x80) == 0 || (pWInfo->pSelect != (Select *)0x0))
            || ((sqlite3Config.xTestCallback != (_func_int_int *)0x0 &&
                (iVar14 = (*sqlite3Config.xTestCallback)(700), iVar14 != 0)))))) goto LAB_0018b56f;
      }
      else {
        uVar15 = whereIsCoveringIndex(pWInfo,pIdx,pSVar5->a[bVar3].iCursor);
        if (uVar15 != 0) {
          local_b8 = 0;
          uVar15 = uVar15 | pTemplate->wsFlags;
          goto LAB_0018b56f;
        }
      }
    }
    else {
      local_b8 = 0;
      uVar15 = 0x240;
LAB_0018b56f:
      pTemplate->wsFlags = uVar15;
    }
    uVar9 = uVar21;
    if (((((bVar8) && (uVar9 = '\0', (pTVar6->tabFlags & 0x80) == 0)) &&
         (pIdx->pPartIdxWhere == (Expr *)0x0)) && ((pSVar5->a[bVar3].fg.field_0x1 & 2) == 0)) &&
       (((local_b8 != 0 || ((pIdx->field_0x63 & 4) != 0)) ||
        (((pTVar6->szTabRow <= pIdx->szIdxRow ||
          (((pWInfo->wctrlFlags & 4) != 0 || (sqlite3Config.bUseCis == '\0')))) ||
         ((pWInfo->pParse->db->dbOptFlags & 0x20) != 0)))))) goto LAB_0018b70f;
    pTemplate->iSortIdx = uVar9;
    pTemplate->rRun = (short)((pIdx->szIdxRow * 0xf) / (int)pTVar6->szTabRow) + sVar12 + 1;
    if (local_b8 != 0) {
      b = sVar12 + 0x10;
      iVar14 = pSVar5->a[bVar3].iCursor;
      lVar23 = 0x14;
      for (lVar20 = 0; lVar20 < (pWInfo->sWC).nTerm; lVar20 = lVar20 + 1) {
        pWVar17 = (pWInfo->sWC).a;
        iVar16 = sqlite3ExprCoveredByIndex(*(Expr **)((long)pWVar17 + lVar23 + -0x14),iVar14,pIdx);
        if (iVar16 == 0) break;
        uVar10 = *(ushort *)((long)pWVar17 + lVar23 + -4);
        if (0 < (short)uVar10) {
          uVar10 = -(ushort)((*(byte *)((long)&pWVar17->pExpr + lVar23) & 0x82) == 0) | 0xffec;
        }
        b = uVar10 + b;
        lVar23 = lVar23 + 0x38;
      }
      LVar11 = sqlite3LogEstAdd(pTemplate->rRun,b);
      pTemplate->rRun = LVar11;
    }
    whereLoopOutputAdjust(pWC,pTemplate,sVar12);
    if (((pSVar5->a[bVar3].fg.jointype & 0x10) != 0) && (pIdx->aColExpr != (ExprList *)0x0)) {
      pTemplate->nOut = sVar12;
      goto LAB_0018b70f;
    }
    iVar14 = whereLoopInsert(pBuilder,pTemplate);
    pTemplate->nOut = sVar12;
  }
  if (iVar14 != 0) goto LAB_0018b91c;
LAB_0018b70f:
  pBuilder->bldFlags1 = '\0';
  iVar14 = whereLoopAddBtreeIndex(pBuilder,pSVar5->a + bVar3,pIdx,0);
  if (pBuilder->bldFlags1 == '\x01') {
    pbVar1 = (byte *)((long)&pTVar6->tabFlags + 1);
    *pbVar1 = *pbVar1 | 1;
  }
LAB_0018b736:
  if ((pSVar5->a[bVar3].fg.field_0x1 & 2) == 0) {
    pIdx = pIdx->pNext;
  }
  else {
    pIdx = (Index *)0x0;
  }
  uVar21 = uVar21 + '\x01';
  goto LAB_0018b29a;
}

Assistant:

static int whereLoopAddBtree(
  WhereLoopBuilder *pBuilder, /* WHERE clause information */
  Bitmask mPrereq             /* Extra prerequisites for using this table */
){
  WhereInfo *pWInfo;          /* WHERE analysis context */
  Index *pProbe;              /* An index we are evaluating */
  Index sPk;                  /* A fake index object for the primary key */
  LogEst aiRowEstPk[2];       /* The aiRowLogEst[] value for the sPk index */
  i16 aiColumnPk = -1;        /* The aColumn[] value for the sPk index */
  SrcList *pTabList;          /* The FROM clause */
  SrcItem *pSrc;              /* The FROM clause btree term to add */
  WhereLoop *pNew;            /* Template WhereLoop object */
  int rc = SQLITE_OK;         /* Return code */
  int iSortIdx = 1;           /* Index number */
  int b;                      /* A boolean value */
  LogEst rSize;               /* number of rows in the table */
  WhereClause *pWC;           /* The parsed WHERE clause */
  Table *pTab;                /* Table being queried */

  pNew = pBuilder->pNew;
  pWInfo = pBuilder->pWInfo;
  pTabList = pWInfo->pTabList;
  pSrc = pTabList->a + pNew->iTab;
  pTab = pSrc->pSTab;
  pWC = pBuilder->pWC;
  assert( !IsVirtual(pSrc->pSTab) );

  if( pSrc->fg.isIndexedBy ){
    assert( pSrc->fg.isCte==0 );
    /* An INDEXED BY clause specifies a particular index to use */
    pProbe = pSrc->u2.pIBIndex;
  }else if( !HasRowid(pTab) ){
    pProbe = pTab->pIndex;
  }else{
    /* There is no INDEXED BY clause.  Create a fake Index object in local
    ** variable sPk to represent the rowid primary key index.  Make this
    ** fake index the first in a chain of Index objects with all of the real
    ** indices to follow */
    Index *pFirst;                  /* First of real indices on the table */
    memset(&sPk, 0, sizeof(Index));
    sPk.nKeyCol = 1;
    sPk.nColumn = 1;
    sPk.aiColumn = &aiColumnPk;
    sPk.aiRowLogEst = aiRowEstPk;
    sPk.onError = OE_Replace;
    sPk.pTable = pTab;
    sPk.szIdxRow = 3;  /* TUNING: Interior rows of IPK table are very small */
    sPk.idxType = SQLITE_IDXTYPE_IPK;
    aiRowEstPk[0] = pTab->nRowLogEst;
    aiRowEstPk[1] = 0;
    pFirst = pSrc->pSTab->pIndex;
    if( pSrc->fg.notIndexed==0 ){
      /* The real indices of the table are only considered if the
      ** NOT INDEXED qualifier is omitted from the FROM clause */
      sPk.pNext = pFirst;
    }
    pProbe = &sPk;
  }
  rSize = pTab->nRowLogEst;

#ifndef SQLITE_OMIT_AUTOMATIC_INDEX
  /* Automatic indexes */
  if( !pBuilder->pOrSet      /* Not part of an OR optimization */
   && (pWInfo->wctrlFlags & (WHERE_RIGHT_JOIN|WHERE_OR_SUBCLAUSE))==0
   && (pWInfo->pParse->db->flags & SQLITE_AutoIndex)!=0
   && !pSrc->fg.isIndexedBy  /* Has no INDEXED BY clause */
   && !pSrc->fg.notIndexed   /* Has no NOT INDEXED clause */
   && !pSrc->fg.isCorrelated /* Not a correlated subquery */
   && !pSrc->fg.isRecursive  /* Not a recursive common table expression. */
   && (pSrc->fg.jointype & JT_RIGHT)==0 /* Not the right tab of a RIGHT JOIN */
  ){
    /* Generate auto-index WhereLoops */
    LogEst rLogSize;         /* Logarithm of the number of rows in the table */
    WhereTerm *pTerm;
    WhereTerm *pWCEnd = pWC->a + pWC->nTerm;
    rLogSize = estLog(rSize);
    for(pTerm=pWC->a; rc==SQLITE_OK && pTerm<pWCEnd; pTerm++){
      if( pTerm->prereqRight & pNew->maskSelf ) continue;
      if( termCanDriveIndex(pTerm, pSrc, 0) ){
        pNew->u.btree.nEq = 1;
        pNew->nSkip = 0;
        pNew->u.btree.pIndex = 0;
        pNew->nLTerm = 1;
        pNew->aLTerm[0] = pTerm;
        /* TUNING: One-time cost for computing the automatic index is
        ** estimated to be X*N*log2(N) where N is the number of rows in
        ** the table being indexed and where X is 7 (LogEst=28) for normal
        ** tables or 0.5 (LogEst=-10) for views and subqueries.  The value
        ** of X is smaller for views and subqueries so that the query planner
        ** will be more aggressive about generating automatic indexes for
        ** those objects, since there is no opportunity to add schema
        ** indexes on subqueries and views. */
        pNew->rSetup = rLogSize + rSize;
        if( !IsView(pTab) && (pTab->tabFlags & TF_Ephemeral)==0 ){
          pNew->rSetup += 28;
        }else{
          pNew->rSetup -= 25;  /* Greatly reduced setup cost for auto indexes
                               ** on ephemeral materializations of views */
        }
        ApplyCostMultiplier(pNew->rSetup, pTab->costMult);
        if( pNew->rSetup<0 ) pNew->rSetup = 0;
        /* TUNING: Each index lookup yields 20 rows in the table.  This
        ** is more than the usual guess of 10 rows, since we have no way
        ** of knowing how selective the index will ultimately be.  It would
        ** not be unreasonable to make this value much larger. */
        pNew->nOut = 43;  assert( 43==sqlite3LogEst(20) );
        pNew->rRun = sqlite3LogEstAdd(rLogSize,pNew->nOut);
        pNew->wsFlags = WHERE_AUTO_INDEX;
        pNew->prereq = mPrereq | pTerm->prereqRight;
        rc = whereLoopInsert(pBuilder, pNew);
      }
    }
  }
#endif /* SQLITE_OMIT_AUTOMATIC_INDEX */

  /* Loop over all indices. If there was an INDEXED BY clause, then only
  ** consider index pProbe.  */
  for(; rc==SQLITE_OK && pProbe;
      pProbe=(pSrc->fg.isIndexedBy ? 0 : pProbe->pNext), iSortIdx++
  ){
    if( pProbe->pPartIdxWhere!=0
     && !whereUsablePartialIndex(pSrc->iCursor, pSrc->fg.jointype, pWC,
                                 pProbe->pPartIdxWhere)
    ){
      testcase( pNew->iTab!=pSrc->iCursor );  /* See ticket [98d973b8f5] */
      continue;  /* Partial index inappropriate for this query */
    }
    if( pProbe->bNoQuery ) continue;
    rSize = pProbe->aiRowLogEst[0];
    pNew->u.btree.nEq = 0;
    pNew->u.btree.nBtm = 0;
    pNew->u.btree.nTop = 0;
    pNew->nSkip = 0;
    pNew->nLTerm = 0;
    pNew->iSortIdx = 0;
    pNew->rSetup = 0;
    pNew->prereq = mPrereq;
    pNew->nOut = rSize;
    pNew->u.btree.pIndex = pProbe;
    pNew->u.btree.pOrderBy = 0;
    b = indexMightHelpWithOrderBy(pBuilder, pProbe, pSrc->iCursor);

    /* The ONEPASS_DESIRED flags never occurs together with ORDER BY */
    assert( (pWInfo->wctrlFlags & WHERE_ONEPASS_DESIRED)==0 || b==0 );
    if( pProbe->idxType==SQLITE_IDXTYPE_IPK ){
      /* Integer primary key index */
      pNew->wsFlags = WHERE_IPK;

      /* Full table scan */
      pNew->iSortIdx = b ? iSortIdx : 0;
      /* TUNING: Cost of full table scan is 3.0*N.  The 3.0 factor is an
      ** extra cost designed to discourage the use of full table scans,
      ** since index lookups have better worst-case performance if our
      ** stat guesses are wrong.  Reduce the 3.0 penalty slightly
      ** (to 2.75) if we have valid STAT4 information for the table.
      ** At 2.75, a full table scan is preferred over using an index on
      ** a column with just two distinct values where each value has about
      ** an equal number of appearances.  Without STAT4 data, we still want
      ** to use an index in that case, since the constraint might be for
      ** the scarcer of the two values, and in that case an index lookup is
      ** better.
      */
#ifdef SQLITE_ENABLE_STAT4
      pNew->rRun = rSize + 16 - 2*((pTab->tabFlags & TF_HasStat4)!=0);
#else
      pNew->rRun = rSize + 16;
#endif
      ApplyCostMultiplier(pNew->rRun, pTab->costMult);
      whereLoopOutputAdjust(pWC, pNew, rSize);
      if( pSrc->fg.isSubquery ){
        if( pSrc->fg.viaCoroutine ) pNew->wsFlags |= WHERE_COROUTINE;
        pNew->u.btree.pOrderBy = pSrc->u4.pSubq->pSelect->pOrderBy;
      }
      rc = whereLoopInsert(pBuilder, pNew);
      pNew->nOut = rSize;
      if( rc ) break;
    }else{
      Bitmask m;
      if( pProbe->isCovering ){
        m = 0;
        pNew->wsFlags = WHERE_IDX_ONLY | WHERE_INDEXED;
      }else{
        m = pSrc->colUsed & pProbe->colNotIdxed;
        if( pProbe->pPartIdxWhere ){
          wherePartIdxExpr(
              pWInfo->pParse, pProbe, pProbe->pPartIdxWhere, &m, 0, 0
          );
        }
        pNew->wsFlags = WHERE_INDEXED;
        if( m==TOPBIT || (pProbe->bHasExpr && !pProbe->bHasVCol && m!=0) ){
          u32 isCov = whereIsCoveringIndex(pWInfo, pProbe, pSrc->iCursor);
          if( isCov==0 ){
            WHERETRACE(0x200,
               ("-> %s is not a covering index"
                " according to whereIsCoveringIndex()\n", pProbe->zName));
            assert( m!=0 );
          }else{
            m = 0;
            pNew->wsFlags |= isCov;
            if( isCov & WHERE_IDX_ONLY ){
              WHERETRACE(0x200,
                 ("-> %s is a covering expression index"
                  " according to whereIsCoveringIndex()\n", pProbe->zName));
            }else{
              assert( isCov==WHERE_EXPRIDX );
              WHERETRACE(0x200,
                 ("-> %s might be a covering expression index"
                  " according to whereIsCoveringIndex()\n", pProbe->zName));
            }
          }
        }else if( m==0
           && (HasRowid(pTab) || pWInfo->pSelect!=0 || sqlite3FaultSim(700))
        ){
          WHERETRACE(0x200,
             ("-> %s a covering index according to bitmasks\n",
             pProbe->zName, m==0 ? "is" : "is not"));
          pNew->wsFlags = WHERE_IDX_ONLY | WHERE_INDEXED;
        }
      }

      /* Full scan via index */
      if( b
       || !HasRowid(pTab)
       || pProbe->pPartIdxWhere!=0
       || pSrc->fg.isIndexedBy
       || ( m==0
         && pProbe->bUnordered==0
         && (pProbe->szIdxRow<pTab->szTabRow)
         && (pWInfo->wctrlFlags & WHERE_ONEPASS_DESIRED)==0
         && sqlite3GlobalConfig.bUseCis
         && OptimizationEnabled(pWInfo->pParse->db, SQLITE_CoverIdxScan)
          )
      ){
        pNew->iSortIdx = b ? iSortIdx : 0;

        /* The cost of visiting the index rows is N*K, where K is
        ** between 1.1 and 3.0, depending on the relative sizes of the
        ** index and table rows. */
        pNew->rRun = rSize + 1 + (15*pProbe->szIdxRow)/pTab->szTabRow;
        if( m!=0 ){
          /* If this is a non-covering index scan, add in the cost of
          ** doing table lookups.  The cost will be 3x the number of
          ** lookups.  Take into account WHERE clause terms that can be
          ** satisfied using just the index, and that do not require a
          ** table lookup. */
          LogEst nLookup = rSize + 16;  /* Base cost:  N*3 */
          int ii;
          int iCur = pSrc->iCursor;
          WhereClause *pWC2 = &pWInfo->sWC;
          for(ii=0; ii<pWC2->nTerm; ii++){
            WhereTerm *pTerm = &pWC2->a[ii];
            if( !sqlite3ExprCoveredByIndex(pTerm->pExpr, iCur, pProbe) ){
              break;
            }
            /* pTerm can be evaluated using just the index.  So reduce
            ** the expected number of table lookups accordingly */
            if( pTerm->truthProb<=0 ){
              nLookup += pTerm->truthProb;
            }else{
              nLookup--;
              if( pTerm->eOperator & (WO_EQ|WO_IS) ) nLookup -= 19;
            }
          }

          pNew->rRun = sqlite3LogEstAdd(pNew->rRun, nLookup);
        }
        ApplyCostMultiplier(pNew->rRun, pTab->costMult);
        whereLoopOutputAdjust(pWC, pNew, rSize);
        if( (pSrc->fg.jointype & JT_RIGHT)!=0 && pProbe->aColExpr ){
          /* Do not do an SCAN of a index-on-expression in a RIGHT JOIN
          ** because the cursor used to access the index might not be
          ** positioned to the correct row during the right-join no-match
          ** loop. */
        }else{
          rc = whereLoopInsert(pBuilder, pNew);
        }
        pNew->nOut = rSize;
        if( rc ) break;
      }
    }

    pBuilder->bldFlags1 = 0;
    rc = whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, 0);
    if( pBuilder->bldFlags1==SQLITE_BLDF1_INDEXED ){
      /* If a non-unique index is used, or if a prefix of the key for
      ** unique index is used (making the index functionally non-unique)
      ** then the sqlite_stat1 data becomes important for scoring the
      ** plan */
      pTab->tabFlags |= TF_MaybeReanalyze;
    }
#ifdef SQLITE_ENABLE_STAT4
    sqlite3Stat4ProbeFree(pBuilder->pRec);
    pBuilder->nRecValid = 0;
    pBuilder->pRec = 0;
#endif
  }
  return rc;
}